

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinSerializer<std::tuple<int,bool,char,std::vector<int,std::allocator<int>>>,void>::
     serialize_elems<OutputStream,0ul,1ul,2ul,3ul>
               (vector<int,_std::allocator<int>_> *t,OutputStream *ostream)

{
  undefined4 in_EAX;
  undefined4 uStack_18;
  undefined4 local_14;
  
  _uStack_18 = CONCAT44(*(undefined4 *)
                         ((long)&t[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + 4),in_EAX);
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&local_14);
  uStack_18._0_3_ =
       CONCAT12(*(undefined1 *)
                 ((long)&t[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1),(undefined2)uStack_18);
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&uStack_18 + 2);
  uStack_18 = CONCAT13(*(undefined1 *)
                        &t[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,(undefined3)uStack_18);
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&uStack_18 + 3);
  BuiltinSerializer<std::vector<int,_std::allocator<int>_>,_void>::serialize<OutputStream>
            (t,ostream);
  return;
}

Assistant:

static void serialize_elems(const Tuple<E...>& t, OutputStream& ostream, std::index_sequence<I...>)
  {
    using swallow = int[];
    using std::get;
    (void)swallow{1, (mserialize::serialize(get<I>(t), ostream), int{})...};
  }